

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueue.h
# Opt level: O0

void __thiscall
rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::pop
          (Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> *this,int *v)

{
  atomic<unsigned_long> *paVar1;
  size_t sVar2;
  Slot<int> *pSVar3;
  int *piVar4;
  size_t sVar5;
  Slot<int> *slot;
  __int_type tail;
  int *v_local;
  Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> *this_local;
  memory_order __b;
  memory_order __b_1;
  
  paVar1 = &this->tail_;
  LOCK();
  sVar5 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  pSVar3 = this->slots_;
  sVar2 = idx(this,sVar5);
  pSVar3 = pSVar3 + sVar2;
  do {
    sVar2 = turn(this,sVar5);
    std::operator&(memory_order_acquire,__memory_order_mask);
  } while (sVar2 * 2 + 1 != (pSVar3->turn).super___atomic_base<unsigned_long>._M_i);
  piVar4 = Slot<int>::move(pSVar3);
  *v = *piVar4;
  Slot<int>::destroy(pSVar3);
  sVar5 = turn(this,sVar5);
  std::operator&(memory_order_release,__memory_order_mask);
  (pSVar3->turn).super___atomic_base<unsigned_long>._M_i = sVar5 * 2 + 2;
  return;
}

Assistant:

void pop(T &v) noexcept {
    auto const tail = tail_.fetch_add(1);
    auto &slot = slots_[idx(tail)];
    while (turn(tail) * 2 + 1 != slot.turn.load(std::memory_order_acquire))
      ;
    v = slot.move();
    slot.destroy();
    slot.turn.store(turn(tail) * 2 + 2, std::memory_order_release);
  }